

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O1

sxi32 VmJsonTokenize(SyStream *pStream,SyToken *pToken,void *pUserData,void *pCtxData)

{
  byte *pbVar1;
  sxi32 sVar2;
  ushort **ppuVar3;
  byte *pbVar4;
  sxu32 sVar5;
  long lVar6;
  ulong uVar7;
  byte *pbVar8;
  byte bVar9;
  uint uVar10;
  byte *pbVar11;
  byte *pbVar12;
  bool bVar13;
  
  pbVar11 = pStream->zText;
  pbVar1 = pStream->zEnd;
  bVar13 = pbVar11 < pbVar1;
  if (!bVar13) {
    return -0x12;
  }
  bVar9 = *pbVar11;
  if (bVar9 < 0xc0) {
    ppuVar3 = __ctype_b_loc();
    pbVar11 = pbVar11 + 1;
    do {
      if ((*(byte *)((long)*ppuVar3 + (ulong)bVar9 * 2 + 1) & 0x20) == 0) break;
      if (bVar9 == 10) {
        pStream->nLine = pStream->nLine + 1;
      }
      pStream->zText = pbVar11;
      bVar13 = pbVar11 < pbVar1;
      if (pbVar11 == pbVar1) {
        return -0x12;
      }
      bVar9 = *pbVar11;
      pbVar11 = pbVar11 + 1;
    } while (bVar9 < 0xc0);
    pbVar11 = pbVar11 + -1;
  }
  if (!bVar13) {
    return -0x12;
  }
  pToken->nLine = pStream->nLine;
  pToken->pUserData = (void *)0x0;
  (pToken->sData).zString = (char *)pbVar11;
  (pToken->sData).nByte = 0;
  bVar9 = *pbVar11;
  uVar7 = (ulong)bVar9;
  if (((0xbf < uVar7) || (ppuVar3 = __ctype_b_loc(), uVar7 == 0x5f)) ||
     (((*ppuVar3)[uVar7] & 0x400) != 0)) {
    if (bVar9 < 0xc0) {
      pStream->zText = pbVar11 + 1;
    }
    pbVar12 = pStream->zText;
    do {
      pbVar4 = pbVar12;
      if (0xbf < *pbVar12) {
        pbVar4 = pbVar12 + 1;
      }
      pbVar8 = pbVar4;
      if (pbVar4 < pbVar1) {
        lVar6 = (long)pbVar1 - (long)pbVar4;
        do {
          uVar7 = (ulong)*pbVar4;
          pbVar8 = pbVar4;
          if ((0xbf < uVar7) ||
             ((ppuVar3 = __ctype_b_loc(), uVar7 != 0x5f && (((*ppuVar3)[uVar7] & 8) == 0)))) break;
          pbVar4 = pbVar4 + 1;
          lVar6 = lVar6 + -1;
          pbVar8 = pbVar1;
        } while (lVar6 != 0);
      }
      if (pbVar8 == pbVar12) {
        uVar10 = (int)pbVar12 - (int)pbVar11;
        (pToken->sData).nByte = uVar10;
        pToken->nType = 0x800;
        if ((uVar10 == 4) && (sVar2 = SyStrnicmp((char *)pbVar11,"true",4), sVar2 == 0)) {
          pToken->nType = 1;
          return 0;
        }
        if (uVar10 == 4) {
          sVar2 = SyStrnicmp((char *)pbVar11,"null",4);
          if (sVar2 != 0) {
            return 0;
          }
          pToken->nType = 8;
          return 0;
        }
        if (uVar10 != 5) {
          return 0;
        }
        sVar2 = SyStrnicmp((char *)pbVar11,"false",5);
        if (sVar2 != 0) {
          return 0;
        }
        pToken->nType = 2;
        return 0;
      }
      pStream->zText = pbVar8;
      pbVar12 = pbVar8;
    } while( true );
  }
  if (bVar9 < 0x5b) {
    if (bVar9 == 0x22) {
      pbVar11 = pbVar11 + 1;
      pStream->zText = pbVar11;
      (pToken->sData).zString = (char *)pbVar11;
      while (pbVar11 < pbVar1) {
        if (*pbVar11 == 10) {
          pStream->nLine = pStream->nLine + 1;
        }
        else if ((*pbVar11 == 0x22) && (pbVar11[-1] != 0x5c)) {
          if (pbVar11 < pbVar1) {
            pToken->nType = 4;
            goto LAB_0012cf25;
          }
          break;
        }
        pbVar11 = pbVar11 + 1;
        pStream->zText = pbVar11;
      }
      pToken->nType = 0x1000;
      *(undefined4 *)pUserData = 0xfffffff4;
      goto LAB_0012cf2c;
    }
    if (bVar9 == 0x2c) {
      sVar5 = 0x400;
    }
    else {
      if (bVar9 != 0x3a) goto LAB_0012ce05;
      sVar5 = 0x200;
    }
  }
  else if (bVar9 < 0x7b) {
    sVar5 = 0x80;
    if (bVar9 != 0x5b) {
      if (bVar9 != 0x5d) {
LAB_0012ce05:
        if (((((*ppuVar3)[uVar7] >> 0xb & 1) == 0) && (uVar7 != 0x2d)) && (bVar9 != 0x2b)) {
          pToken->nType = 0x1000;
          pStream->zText = pbVar11 + 1;
          *(undefined4 *)pUserData = 0xfffffff4;
          return -10;
        }
        pbVar12 = pbVar11 + 1;
        pStream->zText = pbVar12;
        pToken->nType = 0x10;
        bVar13 = pbVar12 < pbVar1;
        if (bVar13) {
          bVar9 = *pbVar12;
          if (bVar9 < 0xc0) {
            pbVar11 = pbVar11 + 2;
            do {
              if ((*(byte *)((long)*ppuVar3 + (ulong)bVar9 * 2 + 1) & 8) == 0) break;
              pStream->zText = pbVar11;
              bVar13 = pbVar11 < pbVar1;
              if (!bVar13) goto LAB_0012cf2c;
              bVar9 = *pbVar11;
              pbVar11 = pbVar11 + 1;
            } while (bVar9 < 0xc0);
            pbVar12 = pbVar11 + -1;
          }
          if (bVar13) {
            if (*pbVar12 == 0x2e) {
              do {
                pbVar11 = pbVar12;
                pbVar12 = pbVar11 + 1;
                pStream->zText = pbVar12;
                if (pbVar1 <= pbVar12) goto LAB_0012cf2c;
              } while (((ulong)*pbVar12 < 0xc0) &&
                      ((*(byte *)((long)*ppuVar3 + (ulong)*pbVar12 * 2 + 1) & 8) != 0));
              if ((pbVar12 < pbVar1) && ((*pbVar12 & 0xdf) == 0x45)) {
                pbVar12 = pbVar11 + 2;
                pStream->zText = pbVar12;
                if (pbVar12 < pbVar1) {
                  if ((*pbVar12 == 0x2d) || (*pbVar12 == 0x2b)) {
                    pStream->zText = pbVar11 + 3;
                  }
                  pbVar11 = pStream->zText;
                  if (pbVar11 < pbVar1) {
                    do {
                      if ((0xbf < (ulong)*pbVar11) ||
                         ((*(byte *)((long)*ppuVar3 + (ulong)*pbVar11 * 2 + 1) & 8) == 0)) break;
                      pbVar11 = pbVar11 + 1;
                      pStream->zText = pbVar11;
                    } while (pbVar11 != pbVar1);
                  }
                }
              }
            }
            else if ((*pbVar12 & 0xdf) == 0x45) {
              pbVar11 = pbVar12 + 1;
              pStream->zText = pbVar11;
              if (pbVar11 < pbVar1) {
                if ((*pbVar11 == 0x2d) || (*pbVar11 == 0x2b)) {
                  pStream->zText = pbVar12 + 2;
                }
                pbVar11 = pStream->zText;
                if (pbVar11 < pbVar1) {
                  do {
                    if ((0xbf < (ulong)*pbVar11) ||
                       ((*(byte *)((long)*ppuVar3 + (ulong)*pbVar11 * 2 + 1) & 8) == 0)) break;
                    pbVar11 = pbVar11 + 1;
                    pStream->zText = pbVar11;
                  } while (pbVar11 != pbVar1);
                }
              }
            }
          }
        }
        goto LAB_0012cf2c;
      }
      sVar5 = 0x100;
    }
  }
  else if (bVar9 == 0x7d) {
    sVar5 = 0x40;
  }
  else {
    if (bVar9 != 0x7b) goto LAB_0012ce05;
    sVar5 = 0x20;
  }
  pToken->nType = sVar5;
LAB_0012cf25:
  pStream->zText = pbVar11 + 1;
LAB_0012cf2c:
  uVar10 = *(int *)&pStream->zText - *(int *)&(pToken->sData).zString;
  (pToken->sData).nByte = uVar10;
  if (pToken->nType == 4) {
    (pToken->sData).nByte = uVar10 - 1;
  }
  return 0;
}

Assistant:

static sxi32 VmJsonTokenize(SyStream *pStream, SyToken *pToken, void *pUserData, void *pCtxData)
{
	int *pJsonErr = (int *)pUserData;
	SyString *pStr;
	int c;
	/* Ignore leading white spaces */
	while( pStream->zText < pStream->zEnd && pStream->zText[0] < 0xc0 && SyisSpace(pStream->zText[0]) ){
		/* Advance the stream cursor */
		if( pStream->zText[0] == '\n' ){
			/* Update line counter */
			pStream->nLine++;
		}
		pStream->zText++;
	}
	if( pStream->zText >= pStream->zEnd ){
		/* End of input reached */
		SXUNUSED(pCtxData); /* cc warning */
		return SXERR_EOF;
	}
	/* Record token starting position and line */
	pToken->nLine = pStream->nLine;
	pToken->pUserData = 0;
	pStr = &pToken->sData;
	SyStringInitFromBuf(pStr, pStream->zText, 0);
	if( pStream->zText[0] >= 0xc0 || SyisAlpha(pStream->zText[0]) || pStream->zText[0] == '_' ){
		/* The following code fragment is taken verbatim from the xPP source tree.
		 * xPP is a modern embeddable macro processor with advanced features useful for
		 * application seeking for a production quality, ready to use macro processor.
		 * xPP is a widely used library developed and maintened by Symisc Systems.
		 * You can reach the xPP home page by following this link:
		 * http://xpp.symisc.net/
		 */
		const unsigned char *zIn;
		/* Isolate UTF-8 or alphanumeric stream */
		if( pStream->zText[0] < 0xc0 ){
			pStream->zText++;
		}
		for(;;){
			zIn = pStream->zText;
			if( zIn[0] >= 0xc0 ){
				zIn++;
				/* UTF-8 stream */
				while( zIn < pStream->zEnd && ((zIn[0] & 0xc0) == 0x80) ){
					zIn++;
				}
			}
			/* Skip alphanumeric stream */
			while( zIn < pStream->zEnd && zIn[0] < 0xc0 && (SyisAlphaNum(zIn[0]) || zIn[0] == '_') ){
				zIn++;
			}
			if( zIn == pStream->zText ){
				/* Not an UTF-8 or alphanumeric stream */
				break;
			}
			/* Synchronize pointers */
			pStream->zText = zIn;
		}
		/* Record token length */
		pStr->nByte = (sxu32)((const char *)pStream->zText-pStr->zString);
		/* A simple identifier */
		pToken->nType = JSON_TK_ID;
		if( pStr->nByte == sizeof("true") -1 && SyStrnicmp(pStr->zString, "true", sizeof("true")-1) == 0 ){
			/* boolean true */
			pToken->nType = JSON_TK_TRUE;
		}else if( pStr->nByte == sizeof("false") -1 && SyStrnicmp(pStr->zString,"false", sizeof("false")-1) == 0 ){
			/* boolean false */
			pToken->nType = JSON_TK_FALSE;
		}else if( pStr->nByte == sizeof("null") -1 && SyStrnicmp(pStr->zString,"null", sizeof("null")-1) == 0 ){
			/* NULL */
			pToken->nType = JSON_TK_NULL;
		}
		return SXRET_OK;
	}
	if( pStream->zText[0] == '{' || pStream->zText[0] == '[' || pStream->zText[0] == '}' || pStream->zText[0] == ']'
		|| pStream->zText[0] == ':' || pStream->zText[0] == ',' ){
			/* Single character */
			c = pStream->zText[0];
			/* Set token type */
			switch(c){
			case '[': pToken->nType = JSON_TK_OSB;   break;
			case '{': pToken->nType = JSON_TK_OCB;   break;
			case '}': pToken->nType = JSON_TK_CCB;   break;
			case ']': pToken->nType = JSON_TK_CSB;   break;
			case ':': pToken->nType = JSON_TK_COLON; break;
			case ',': pToken->nType = JSON_TK_COMMA; break;
			default:
				break;
			}
			/* Advance the stream cursor */
			pStream->zText++;
	}else if( pStream->zText[0] == '"') {
		/* JSON string */
		pStream->zText++;
		pStr->zString++;
		/* Delimit the string */
		while( pStream->zText < pStream->zEnd ){
			if( pStream->zText[0] == '"' && pStream->zText[-1] != '\\' ){
				break;
			}
			if( pStream->zText[0] == '\n' ){
				/* Update line counter */
				pStream->nLine++;
			}
			pStream->zText++;
		}
		if( pStream->zText >= pStream->zEnd ){
			/* Missing closing '"' */
			pToken->nType = JSON_TK_INVALID;
			*pJsonErr = SXERR_SYNTAX;
		}else{
			pToken->nType = JSON_TK_STR;
			pStream->zText++; /* Jump the closing double quotes */
		}
	}else if( (pStream->zText[0] < 0xc0 && SyisDigit(pStream->zText[0]))
	        || pStream->zText[0] == '-' || pStream->zText[0] == '+' ){
		/* Number */
		pStream->zText++;
		pToken->nType = JSON_TK_NUM;
		while( pStream->zText < pStream->zEnd && pStream->zText[0] < 0xc0 && SyisDigit(pStream->zText[0]) ){
			pStream->zText++;
		}
		if( pStream->zText < pStream->zEnd ){
			c = pStream->zText[0];
			if( c == '.' ){
					/* Real number */
					pStream->zText++;
					while( pStream->zText < pStream->zEnd && pStream->zText[0] < 0xc0 && SyisDigit(pStream->zText[0]) ){
						pStream->zText++;
					}
					if( pStream->zText < pStream->zEnd ){
						c = pStream->zText[0];
						if( c=='e' || c=='E' ){
							pStream->zText++;
							if( pStream->zText < pStream->zEnd ){
								c = pStream->zText[0];
								if( c =='+' || c=='-' ){
									pStream->zText++;
								}
								while( pStream->zText < pStream->zEnd && pStream->zText[0] < 0xc0 && SyisDigit(pStream->zText[0]) ){
									pStream->zText++;
								}
							}
						}
					}					
				}else if( c=='e' || c=='E' ){
					/* Real number */
					pStream->zText++;
					if( pStream->zText < pStream->zEnd ){
						c = pStream->zText[0];
						if( c =='+' || c=='-' ){
							pStream->zText++;
						}
						while( pStream->zText < pStream->zEnd && pStream->zText[0] < 0xc0 && SyisDigit(pStream->zText[0]) ){
							pStream->zText++;
						}
					}					
				}
			}
	}else{
		/* Unexpected token */
		pToken->nType = JSON_TK_INVALID;
		/* Advance the stream cursor */
		pStream->zText++;
		*pJsonErr = SXERR_SYNTAX;
		/* Abort processing immediatley */
		return SXERR_ABORT;
	}
	/* record token length */
	pStr->nByte = (sxu32)((const char *)pStream->zText-pStr->zString);
	if( pToken->nType == JSON_TK_STR ){
		pStr->nByte--;
	}
	/* Return to the lexer */
	return SXRET_OK;
}